

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2a17f::
TestRunnerFixtureTestRunnerOnlyRunsTestsInSpecifiedSuiteAndThatPassPredicateHelper::RunImpl
          (TestRunnerFixtureTestRunnerOnlyRunsTestsInSpecifiedSuiteAndThatPassPredicateHelper *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_1b0 [2];
  TestDetails local_170 [2];
  TestDetails local_130;
  int local_10c;
  RunTestIfNameIs local_108;
  undefined1 local_100 [8];
  Test skippedTest4;
  Test skippedTest3;
  undefined1 local_80 [8];
  Test skippedTest2;
  Test runningTest1;
  TestRunnerFixtureTestRunnerOnlyRunsTestsInSpecifiedSuiteAndThatPassPredicateHelper *this_local;
  
  UnitTest::Test::Test((Test *)&skippedTest2.m_timeConstraintExempt,"goodtest","suite","",0);
  UnitTest::Test::Test((Test *)local_80,"goodtest","DefaultSuite","",0);
  UnitTest::Test::Test((Test *)&skippedTest4.m_timeConstraintExempt,"badtest","suite","",0);
  UnitTest::Test::Test((Test *)local_100,"badtest","DefaultSuite","",0);
  UnitTest::TestList::Add
            (&(this->super_TestRunnerFixture).list,(Test *)&skippedTest2.m_timeConstraintExempt);
  UnitTest::TestList::Add(&(this->super_TestRunnerFixture).list,(Test *)local_80);
  UnitTest::TestList::Add
            (&(this->super_TestRunnerFixture).list,(Test *)&skippedTest4.m_timeConstraintExempt);
  UnitTest::TestList::Add(&(this->super_TestRunnerFixture).list,(Test *)local_100);
  RunTestIfNameIs::RunTestIfNameIs(&local_108,"goodtest");
  UnitTest::TestRunner::RunTestsIf<(anonymous_namespace)::RunTestIfNameIs>
            (&(this->super_TestRunnerFixture).runner,&(this->super_TestRunnerFixture).list,"suite",
             &local_108,0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_10c = 1;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_130,*ppTVar3,0x131);
  UnitTest::CheckEqual<int,int>
            (pTVar1,&local_10c,&(this->super_TestRunnerFixture).reporter.testRunCount,&local_130);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_170,*ppTVar3,0x132);
  UnitTest::CheckEqual
            (pTVar1,"goodtest",(this->super_TestRunnerFixture).reporter.lastStartedTest,local_170);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_1b0,*ppTVar3,0x133);
  UnitTest::CheckEqual
            (pTVar1,"suite",(this->super_TestRunnerFixture).reporter.lastStartedSuite,local_1b0);
  UnitTest::Test::~Test((Test *)local_100);
  UnitTest::Test::~Test((Test *)&skippedTest4.m_timeConstraintExempt);
  UnitTest::Test::~Test((Test *)local_80);
  UnitTest::Test::~Test((Test *)&skippedTest2.m_timeConstraintExempt);
  return;
}

Assistant:

TEST_FIXTURE(TestRunnerFixture, TestRunnerOnlyRunsTestsInSpecifiedSuiteAndThatPassPredicate)
{
    Test runningTest1("goodtest", "suite");
    Test skippedTest2("goodtest");
    Test skippedTest3("badtest", "suite");
    Test skippedTest4("badtest");
    
    list.Add(&runningTest1);
    list.Add(&skippedTest2);
    list.Add(&skippedTest3);
    list.Add(&skippedTest4);   

	runner.RunTestsIf(list, "suite", RunTestIfNameIs("goodtest"), 0);

	CHECK_EQUAL(1, reporter.testRunCount);
    CHECK_EQUAL("goodtest", reporter.lastStartedTest); 
    CHECK_EQUAL("suite", reporter.lastStartedSuite);    
}